

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryFlatLoop<duckdb::IntervalAvgState,duckdb::interval_t,duckdb::IntervalAverageOperation>
               (interval_t *idata,AggregateInputData *aggr_input_data,IntervalAvgState **states,
               ValidityMask *mask,idx_t count)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  unsigned_long *puVar4;
  ulong uVar5;
  IntervalAvgState *pIVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  ulong uVar10;
  ulong uVar11;
  int64_t *piVar12;
  idx_t iVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  interval_t iVar17;
  interval_t right;
  interval_t right_00;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      piVar12 = &idata->micros;
      iVar13 = 0;
      do {
        pIVar6 = states[iVar13];
        pIVar6->count = pIVar6->count + 1;
        uVar3 = ((interval_t *)(piVar12 + -1))->months;
        uVar9 = ((interval_t *)(piVar12 + -1))->days;
        iVar17.days = uVar9;
        iVar17.months = uVar3;
        iVar17.micros = *piVar12;
        iVar17 = AddOperator::Operation<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t>
                           (pIVar6->value,iVar17);
        pIVar6->value = iVar17;
        iVar13 = iVar13 + 1;
        piVar12 = piVar12 + 2;
      } while (count != iVar13);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar11 = 0;
    uVar15 = 0;
    do {
      puVar4 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar4 == (unsigned_long *)0x0) {
        uVar16 = uVar15 + 0x40;
        if (count <= uVar15 + 0x40) {
          uVar16 = count;
        }
LAB_00d2102d:
        uVar10 = uVar15;
        if (uVar15 < uVar16) {
          piVar12 = &idata[uVar15].micros;
          do {
            pIVar6 = states[uVar15];
            pIVar6->count = pIVar6->count + 1;
            uVar2 = ((interval_t *)(piVar12 + -1))->months;
            uVar8 = ((interval_t *)(piVar12 + -1))->days;
            right_00.days = uVar8;
            right_00.months = uVar2;
            right_00.micros = *piVar12;
            iVar17 = AddOperator::
                     Operation<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t>
                               (pIVar6->value,right_00);
            pIVar6->value = iVar17;
            uVar15 = uVar15 + 1;
            piVar12 = piVar12 + 2;
            uVar10 = uVar16;
          } while (uVar16 != uVar15);
        }
      }
      else {
        uVar5 = puVar4[uVar11];
        uVar16 = uVar15 + 0x40;
        if (count <= uVar15 + 0x40) {
          uVar16 = count;
        }
        if (uVar5 == 0xffffffffffffffff) goto LAB_00d2102d;
        uVar10 = uVar16;
        if ((uVar5 != 0) && (uVar10 = uVar15, uVar15 < uVar16)) {
          piVar12 = &idata[uVar15].micros;
          uVar14 = 0;
          do {
            if ((uVar5 >> (uVar14 & 0x3f) & 1) != 0) {
              pIVar6 = states[uVar15 + uVar14];
              pIVar6->count = pIVar6->count + 1;
              uVar1 = ((interval_t *)(piVar12 + -1))->months;
              uVar7 = ((interval_t *)(piVar12 + -1))->days;
              right.days = uVar7;
              right.months = uVar1;
              right.micros = *piVar12;
              iVar17 = AddOperator::
                       Operation<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t>
                                 (pIVar6->value,right);
              pIVar6->value = iVar17;
            }
            uVar14 = uVar14 + 1;
            piVar12 = piVar12 + 2;
            uVar10 = uVar16;
          } while (uVar16 - uVar15 != uVar14);
        }
      }
      uVar15 = uVar10;
      uVar11 = uVar11 + 1;
    } while (uVar11 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static inline void UnaryFlatLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                 STATE_TYPE **__restrict states, ValidityMask &mask, idx_t count) {
		if (OP::IgnoreNull() && !mask.AllValid()) {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &base_idx = input.input_idx;
			base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx], input);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx],
							                                                   input);
						}
					}
				}
			}
		} else {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &i = input.input_idx;
			for (i = 0; i < count; i++) {
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[i], idata[i], input);
			}
		}
	}